

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

optional<cmLinkItem> * __thiscall
cmGeneratorTarget::LookupLinkItem
          (optional<cmLinkItem> *__return_storage_ptr__,cmGeneratorTarget *this,string *n,
          cmListFileBacktrace *bt,string *linkFeature,LookupLinkItemScope *scope,
          LookupSelf lookupSelf)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  string *__rhs;
  cmListFileBacktrace local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_108;
  cmLinkItem local_d8;
  undefined1 local_70 [8];
  string name;
  LookupLinkItemScope *scope_local;
  string *linkFeature_local;
  cmListFileBacktrace *bt_local;
  string *n_local;
  cmGeneratorTarget *this_local;
  optional<cmLinkItem> *maybeItem;
  
  std::optional<cmLinkItem>::optional(__return_storage_ptr__);
  bVar1 = IsLinkLookupScope(this,n,&scope->LG);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  CheckCMP0004((string *)local_70,this,n);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    if (lookupSelf == No) {
      __rhs = GetName_abi_cxx11_(this);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,__rhs);
      if (_Var2) goto LAB_00876e15;
    }
    std::__cxx11::string::string((string *)&local_128,(string *)local_70);
    cmListFileBacktrace::cmListFileBacktrace(&local_138,bt);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_108,&local_128,&local_138);
    ResolveLinkItem(&local_d8,this,&local_108,scope->LG,linkFeature);
    std::optional<cmLinkItem>::operator=(__return_storage_ptr__,&local_d8);
    cmLinkItem::~cmLinkItem(&local_d8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_108);
    cmListFileBacktrace::~cmListFileBacktrace(&local_138);
    std::__cxx11::string::~string((string *)&local_128);
  }
LAB_00876e15:
  name.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_70);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmLinkItem> cmGeneratorTarget::LookupLinkItem(
  std::string const& n, cmListFileBacktrace const& bt,
  std::string const& linkFeature, LookupLinkItemScope* scope,
  LookupSelf lookupSelf) const
{
  cm::optional<cmLinkItem> maybeItem;
  if (this->IsLinkLookupScope(n, scope->LG)) {
    return maybeItem;
  }

  std::string name = this->CheckCMP0004(n);
  if (name.empty() ||
      (lookupSelf == LookupSelf::No && name == this->GetName())) {
    return maybeItem;
  }
  maybeItem =
    this->ResolveLinkItem(BT<std::string>(name, bt), scope->LG, linkFeature);
  return maybeItem;
}